

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O2

void Prn_gen<unsigned_long>
               (int nbRn,pfHash hash,vector<unsigned_long,_std::allocator<unsigned_long>_> *hashes)

{
  uint uVar1;
  bool bVar2;
  unsigned_long h;
  unsigned_long hcopy;
  
  printf("Generating %i random numbers : \n",nbRn);
  hcopy = 0;
  uVar1 = ~(nbRn >> 0x1f) & nbRn;
  while (bVar2 = uVar1 != 0, uVar1 = uVar1 - 1, bVar2) {
    (*hash)(&hcopy,8,0,&h);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(hashes,&h);
    hcopy = h;
  }
  return;
}

Assistant:

void Prn_gen (int nbRn, pfHash hash, std::vector<hashtype> & hashes )
{
  assert(nbRn < 0);

  printf("Generating %i random numbers : \n", nbRn);

  hashtype hcopy;
  memset(&hcopy, 0, sizeof(hcopy));

  // a generated random number becomes the input for the next one
  for (int i=0; i< nbRn; i++) {
      hashtype h;
      hash(&hcopy, sizeof(hcopy), 0, &h);
      hashes.push_back(h);
      memcpy(&hcopy, &h, sizeof(h));
  }
}